

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O1

Type * __thiscall soul::Type::removeConst(Type *__return_storage_ptr__,Type *this)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  
  if (this->isConstant != false) {
    CVar2 = this->arrayElementCategory;
    bVar3 = this->isRef;
    bVar4 = this->isConstant;
    __return_storage_ptr__->category = this->category;
    __return_storage_ptr__->arrayElementCategory = CVar2;
    __return_storage_ptr__->isRef = bVar3;
    __return_storage_ptr__->isConstant = bVar4;
    (__return_storage_ptr__->primitiveType).type = (this->primitiveType).type;
    BVar5 = this->arrayElementBoundingSize;
    __return_storage_ptr__->boundingSize = this->boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = BVar5;
    pSVar1 = (this->structure).object;
    (__return_storage_ptr__->structure).object = pSVar1;
    if (pSVar1 != (Structure *)0x0) {
      (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
    }
    __return_storage_ptr__->isConstant = false;
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("isConst()","removeConst",0x1a3);
}

Assistant:

void checkAssertion (bool condition, const char* message, const char* location, int line)
{
    if (! condition)
        throwInternalCompilerError (message, location, line);
}